

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O2

void __thiscall
PatchCredits::inject_all_checks_signature(PatchCredits *this,ROM *rom,RandomizerWorld *world)

{
  ushort *puVar1;
  ushort uVar2;
  pointer ppIVar3;
  ItemSourceOnGround *item_source;
  Item *pIVar4;
  bool bVar5;
  char cVar6;
  uint32_t uVar7;
  ulong uVar8;
  byte bVar9;
  pointer puVar10;
  pointer ppIVar11;
  initializer_list<unsigned_short> __l;
  allocator<char> local_c1;
  PatchCredits *local_c0;
  ROM *local_b8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> all_checks_signature;
  ByteArray all_checks_bytes;
  Flag flag;
  
  flag._vptr_Flag = (_func_int **)0xfffffeffff3ffeff;
  flag.byte = 0xffff;
  flag.bit = '\0';
  flag._11_5_ = 3;
  __l._M_len = 0x1e;
  __l._M_array = (iterator)&flag;
  local_c0 = this;
  local_b8 = rom;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&all_checks_signature,__l,(allocator_type *)&all_checks_bytes);
  ppIVar11 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar11 == ppIVar3) {
      all_checks_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      all_checks_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      all_checks_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (puVar10 = all_checks_signature.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar10 !=
          all_checks_signature.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
        ByteArray::add_word(&all_checks_bytes,*puVar10);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&flag,"",&local_c1);
      uVar7 = md::ROM::inject_bytes
                        (local_b8,&all_checks_bytes.
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                         (string *)&flag);
      local_c0->_all_checks_bytes_addr = uVar7;
      std::__cxx11::string::~string((string *)&flag);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&all_checks_bytes);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&all_checks_signature.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      return;
    }
    item_source = (ItemSourceOnGround *)*ppIVar11;
    bVar5 = ItemSource::is_ground_item((ItemSource *)item_source);
    if ((bVar5) || (bVar5 = ItemSource::is_shop_item((ItemSource *)item_source), bVar5)) {
      pIVar4 = (item_source->super_ItemSource)._item;
      if (pIVar4 == (Item *)0x0) {
        uVar8 = 0x3f;
      }
      else {
        bVar9 = pIVar4->_id;
        uVar8 = (ulong)bVar9;
        if ((bVar9 == 0x3e) || (bVar9 == 0x7f)) goto LAB_0015cea3;
      }
      cVar6 = (char)uVar8;
      uVar2 = (world->_item_quantities)._M_elems[uVar8];
      if (uVar2 == 0) {
        bVar5 = cVar6 == '\x1b' || cVar6 == '/';
      }
      else {
        bVar5 = pIVar4->_max_quantity < uVar2 && pIVar4->_max_quantity < 9;
      }
      if ((cVar6 == '?') || (bVar5)) {
        PatchFlagsForGroundItems::get_checked_flag_for_item_source
                  ((PatchFlagsForGroundItems *)&flag,item_source);
        bVar9 = flag.bit + 8;
        if ((flag._8_8_ & 1) != 0) {
          bVar9 = flag.bit;
        }
        puVar1 = (ushort *)
                 ((long)all_checks_signature.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start + (ulong)(flag.byte - 0x1060 & 0xfffffffe))
        ;
        *puVar1 = *puVar1 & ((ushort)(-2 << (bVar9 & 0x1f)) |
                            (ushort)(0xfffffffe >> 0x20 - (bVar9 & 0x1f)));
      }
    }
LAB_0015cea3:
    ppIVar11 = ppIVar11 + 1;
  } while( true );
}

Assistant:

void inject_all_checks_signature(md::ROM& rom, RandomizerWorld& world)
    {
        std::vector<uint16_t> all_checks_signature = {
            0xFEFF, 0xFF3F, 0xFEFF, 0xFFFF, 0xFFFF, 0x0300, 0x0000, 0x0000,
            0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
            0xFFFF, 0x7FB3, 0x5EFE, 0xF71F, 0xFCFF, 0xFFFF, 0xFFFF, 0xFFFF,
            0xFFFF, 0xFFFF, 0xFFFF, 0xFF87, 0xF7FF, 0xFF3F
        };

        // If item has less than 9 max quantity in inventory (because items with 9 max are inherently consumable),
        // and the world contains more than the max carriable amount, there is a "golden ending softlock" potential.
        // For instance, taking a first Garlic in a chest makes all Garlic in shops disappear forever, since it can
        // never be consumed. It's also true with basically any unique item in the game that could be put in big
        // amounts in items distribution and would lead to unachievable golden endings.

        // For this reason, we just remove the need for checks that *might* become unobtainable for those reasons.
        // (Oh and also, empty items on ground cannot be taken. That's just sad.)
        for(ItemSource* item_source : world.item_sources())
        {
            if(!item_source->is_ground_item() && !item_source->is_shop_item())
                continue;
            if(item_source->item_id() == ITEM_LIFESTOCK || item_source->item_id() == ITEM_ARCHIPELAGO) // Lifestock can (almost) always be taken
                continue;

            uint8_t item_id = item_source->item_id();
            uint16_t quantity_in_world = world.item_quantities()[item_id];
            uint8_t max_qty = item_source->item()->max_quantity();
            bool more_than_max_inventory = false;
            if(quantity_in_world == 0)
            {
                // If quantity is 0 but we still encounter that item, it means we are in Archipelago / plando context.
                // In that case, distribution is fixed and we only have to care about two cases: Garlic and Logs.
                more_than_max_inventory = (item_id == ITEM_LOGS || item_id == ITEM_GARLIC);
            }
            else if(max_qty < 9 && quantity_in_world > max_qty)
            {
                more_than_max_inventory = true;
            }

            if(item_id == ITEM_NONE || more_than_max_inventory)
            {
                Flag flag = PatchFlagsForGroundItems::get_checked_flag_for_item_source(reinterpret_cast<ItemSourceOnGround*>(item_source));
                size_t word_index = (flag.byte - (PatchFlagsForGroundItems::GROUND_ITEM_FLAGS_START_ADDR & 0xFFFF)) / 2;

                uint8_t bit_index = flag.bit;
                if(flag.byte % 2 == 0)
                    bit_index += 8;
                uint16_t mask = ~(1 << bit_index);

                all_checks_signature[word_index] &= mask;
            }
        }

        ByteArray all_checks_bytes;
        for(uint16_t word : all_checks_signature)
            all_checks_bytes.add_word(word);
        _all_checks_bytes_addr = rom.inject_bytes(all_checks_bytes);
    }